

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O0

void __thiscall
QPixmapStyle::drawSlider
          (QPixmapStyle *this,QStyleOptionComplex *option,QPainter *painter,QWidget *widget)

{
  Orientation OVar1;
  bool bVar2;
  Int IVar3;
  Int IVar4;
  QPixmapStylePrivate *pixmap;
  QStyleOptionSlider *pQVar5;
  QStyle *pQVar6;
  ulong uVar7;
  undefined8 in_RCX;
  undefined8 in_RDX;
  QStyleOption *in_RSI;
  QPixmapStylePrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar8;
  bool bVar9;
  QPixmapStyleDescriptor *desc;
  Orientation orient;
  bool pressed;
  bool enabled;
  QStyleOptionSlider *slider;
  QPixmapStylePrivate *d;
  ControlPixmap pix_1;
  QPixmap pix;
  ControlDescriptor control;
  QRect groove;
  QRect handle;
  SubControl in_stack_fffffffffffffeac;
  QRect *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  QPixmapStylePrivate *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  ControlDescriptor in_stack_fffffffffffffed4;
  QPixmapStyleDescriptor *in_stack_fffffffffffffed8;
  ControlDescriptor local_120;
  ControlDescriptor in_stack_fffffffffffffee4;
  ControlDescriptor control_00;
  QFlagsStorageHelper<QStyle::SubControl,_4> local_a4;
  QPoint local_a0;
  QPoint local_98;
  QSize local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  QPixmapStyleDescriptor local_70;
  ControlDescriptor local_38;
  undefined1 local_34 [16];
  QFlagsStorageHelper<QStyle::SubControl,_4> local_24;
  undefined1 local_20 [16];
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_10;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_c;
  long local_8;
  
  control_00 = (ControlDescriptor)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pixmap = d_func((QPixmapStyle *)0x4001f5);
  pQVar5 = qstyleoption_cast<QStyleOptionSlider_const*>(in_RSI);
  if (pQVar5 != (QStyleOptionSlider *)0x0) {
    local_c.super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorage<QStyle::StateFlag>)
         QFlags<QStyle::StateFlag>::operator&
                   ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac
                   );
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
    bVar8 = IVar3 != 0;
    local_10.super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorage<QStyle::StateFlag>)
         QFlags<QStyle::StateFlag>::operator&
                   ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac
                   );
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
    bVar9 = IVar3 != 0;
    OVar1 = pQVar5->orientation;
    local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar6 = QStyle::proxy((QStyle *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    local_20 = (**(code **)(*(long *)pQVar6 + 0xd8))(pQVar6,3,in_RSI,2,in_RCX);
    local_24.super_QFlagsStorage<QStyle::SubControl>.i =
         (QFlagsStorage<QStyle::SubControl>)
         QFlags<QStyle::SubControl>::operator&
                   ((QFlags<QStyle::SubControl> *)in_stack_fffffffffffffeb0,
                    in_stack_fffffffffffffeac);
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_24);
    if (IVar4 != 0) {
      local_34._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_34._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar6 = QStyle::proxy((QStyle *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                            );
      local_34 = (**(code **)(*(long *)pQVar6 + 0xd8))(pQVar6,3,in_RSI,1,in_RCX);
      bVar2 = QRect::isValid(in_stack_fffffffffffffeb0);
      if (bVar2) {
        if (OVar1 == Horizontal) {
          local_38 = 0x13;
          if (bVar8) {
            local_38 = 0x12;
          }
        }
        else {
          local_38 = 0x18;
          if (bVar8) {
            local_38 = 0x17;
          }
        }
        drawCachedPixmap((QPixmapStyle *)
                         CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),control_00,
                         (QRect *)in_stack_fffffffffffffec8,
                         (QPainter *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        if (OVar1 == Horizontal) {
          if (bVar8) {
            in_stack_fffffffffffffee4 = SG_HActiveEnabled;
            local_38 = in_stack_fffffffffffffee4;
            if (bVar9) {
              in_stack_fffffffffffffee4 = SG_HActivePressed;
              local_38 = in_stack_fffffffffffffee4;
            }
          }
          else {
            in_stack_fffffffffffffee4 = SG_HActiveDisabled;
            local_38 = in_stack_fffffffffffffee4;
          }
        }
        else {
          if (bVar8) {
            local_120 = SG_VActiveEnabled;
            if (bVar9) {
              local_120 = SG_VActivePressed;
            }
          }
          else {
            local_120 = SG_VActiveDisabled;
          }
          local_38 = local_120;
        }
        QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value
                  ((QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)
                   in_stack_fffffffffffffec8,
                   (ControlDescriptor *)
                   CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        in_stack_fffffffffffffed8 = &local_70;
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        local_80 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        in_stack_fffffffffffffed4 = local_38;
        local_90 = QRect::size((QRect *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0
                                                ));
        QPixmapStylePrivate::getCachedPixmap
                  (in_RDI,in_stack_fffffffffffffee4,in_stack_fffffffffffffed8,
                   (QSize *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
        uVar7 = QPixmap::isNull();
        if ((uVar7 & 1) == 0) {
          if (OVar1 == Horizontal) {
            local_98 = QRect::center((QRect *)CONCAT44(in_stack_fffffffffffffed4,
                                                       in_stack_fffffffffffffed0));
            in_stack_fffffffffffffec4 = QPoint::x((QPoint *)0x40055c);
          }
          else {
            local_a0 = QRect::center((QRect *)CONCAT44(in_stack_fffffffffffffed4,
                                                       in_stack_fffffffffffffed0));
            in_stack_fffffffffffffec4 = QPoint::y((QPoint *)0x400584);
          }
          QRect::setRight(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
          QPainter::drawPixmap
                    ((QPainter *)in_stack_fffffffffffffed8,
                     (QRect *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     (QPixmap *)pixmap,
                     (QRect *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        }
        QPixmap::~QPixmap((QPixmap *)&local_88);
        QPixmapStyleDescriptor::~QPixmapStyleDescriptor((QPixmapStyleDescriptor *)0x4005d0);
        in_stack_fffffffffffffec8 = pixmap;
      }
    }
    local_a4.super_QFlagsStorage<QStyle::SubControl>.i =
         (QFlagsStorage<QStyle::SubControl>)
         QFlags<QStyle::SubControl>::operator&
                   ((QFlags<QStyle::SubControl> *)in_stack_fffffffffffffeb0,
                    in_stack_fffffffffffffeac);
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_a4);
    if (IVar4 != 0) {
      bVar2 = QRect::isValid(in_stack_fffffffffffffeb0);
      if (bVar2) {
        if (OVar1 == Horizontal) {
          if (bVar8) {
            in_stack_fffffffffffffec0 = 0xb;
            if (bVar9) {
              in_stack_fffffffffffffec0 = 0xd;
            }
          }
          else {
            in_stack_fffffffffffffec0 = 0xc;
          }
        }
        QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::value
                  ((QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *)
                   in_stack_fffffffffffffec8,
                   (ControlPixmap *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        QPainter::drawPixmap
                  ((QPainter *)in_stack_fffffffffffffed8,
                   (QRect *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (QPixmap *)in_stack_fffffffffffffec8);
        QPixmapStylePixmap::~QPixmapStylePixmap((QPixmapStylePixmap *)0x4006ec);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPixmapStyle::drawSlider(const QStyleOptionComplex *option,
                              QPainter *painter, const QWidget *widget) const
{
#if QT_CONFIG(slider)
    Q_D(const QPixmapStyle);

    const QStyleOptionSlider *slider = qstyleoption_cast<const QStyleOptionSlider*>(option);
    if (!slider)
        return;

    const bool enabled = option->state & State_Enabled;
    const bool pressed = option->state & State_Sunken;
    const Qt::Orientation orient = slider->orientation;

    const QRect handle = proxy()->subControlRect(CC_Slider, option, SC_SliderHandle, widget);
    if (option->subControls & SC_SliderGroove) {
        QRect groove = proxy()->subControlRect(CC_Slider, option, SC_SliderGroove, widget);
        if (groove.isValid()) {
            // Draw the background
            ControlDescriptor control;
            if (orient == Qt::Horizontal)
                control = enabled ? SG_HEnabled : SG_HDisabled;
            else
                control = enabled ? SG_VEnabled : SG_VDisabled;
            drawCachedPixmap(control, groove, painter);

            // Draw the active part
            if (orient == Qt::Horizontal) {
                control = enabled ? (pressed ? SG_HActivePressed : SG_HActiveEnabled )
                                  : SG_HActiveDisabled;
            } else {
                control = enabled ? (pressed ? SG_VActivePressed : SG_VActiveEnabled )
                                  : SG_VActiveDisabled;
            }
            const QPixmapStyleDescriptor &desc = d->descriptors.value(control);
            const QPixmap pix = d->getCachedPixmap(control, desc, groove.size());
            if (!pix.isNull()) {
                groove.setRight(orient == Qt::Horizontal
                               ? handle.center().x() : handle.center().y());
                painter->drawPixmap(groove, pix, groove);
            }
        }
    }
    if (option->subControls & SC_SliderHandle) {
        if (handle.isValid()) {
            ControlPixmap pix;
            if (orient == Qt::Horizontal)
                pix = enabled ? (pressed ? SH_HPressed : SH_HEnabled) : SH_HDisabled;
            else
                pix = enabled ? (pressed ? SH_VPressed : SH_VEnabled) : SH_VDisabled;
            painter->drawPixmap(handle, d->pixmaps.value(pix).pixmap);
        }
    }
#else
    Q_UNUSED(option);
    Q_UNUSED(painter);
    Q_UNUSED(widget);
#endif // QT_CONFIG(slider)
}